

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

FT_Error cf2_getNormalizedVector(PS_Decoder *decoder,FT_UFast *len,FT_Fixed **vec)

{
  FT_Face pFVar1;
  FT_Error FVar2;
  FT_Service_MultiMasters mm;
  TT_Face face;
  FT_Fixed **vec_local;
  FT_UFast *len_local;
  PS_Decoder *decoder_local;
  
  pFVar1 = (decoder->builder).face;
  FVar2 = (*(code *)(pFVar1[3].glyph)->linearVertAdvance)(pFVar1,len,0,vec);
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_getNormalizedVector( PS_Decoder*  decoder,
                           CF2_UInt     *len,
                           FT_Fixed*    *vec )
  {
    TT_Face                  face;
    FT_Service_MultiMasters  mm;


    FT_ASSERT( decoder && decoder->builder.face );
    FT_ASSERT( vec && len );
    FT_ASSERT( !decoder->builder.is_t1 );

    face = (TT_Face)decoder->builder.face;
    mm   = (FT_Service_MultiMasters)face->mm;

    return mm->get_var_blend( FT_FACE( face ), len, NULL, vec, NULL );
  }